

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::DecimalAddOverflowCheck,bool>
               (int *ldata,int *rdata,int *result_data,SelectionVector *lsel,SelectionVector *rsel,
               idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  int iVar1;
  int iVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  OutOfRangeException *pOVar12;
  ulong uVar13;
  idx_t idx_in_entry;
  ulong uVar14;
  idx_t iVar15;
  idx_t iVar16;
  idx_t iVar17;
  string local_78;
  buffer_ptr<ValidityBuffer> *local_50;
  int *local_48;
  int *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = lsel->sel_vector;
      psVar4 = rsel->sel_vector;
      iVar15 = 0;
      do {
        iVar16 = iVar15;
        if (psVar3 != (sel_t *)0x0) {
          iVar16 = (idx_t)psVar3[iVar15];
        }
        iVar17 = iVar15;
        if (psVar4 != (sel_t *)0x0) {
          iVar17 = (idx_t)psVar4[iVar15];
        }
        iVar1 = ldata[iVar16];
        iVar2 = rdata[iVar17];
        if (iVar2 < 0) {
          if (iVar1 < -999999999 - iVar2) goto LAB_0142b69a;
        }
        else if (999999999 - iVar2 < iVar1) {
LAB_0142b69a:
          pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<int,int>(pOVar12,&local_78,iVar1,iVar2);
          __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[iVar15] = iVar2 + iVar1;
        iVar15 = iVar15 + 1;
      } while (count != iVar15);
    }
  }
  else if (count != 0) {
    psVar3 = lsel->sel_vector;
    psVar4 = rsel->sel_vector;
    local_50 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar14 = 0;
    local_48 = rdata;
    local_40 = ldata;
    do {
      uVar9 = uVar14;
      if (psVar3 != (sel_t *)0x0) {
        uVar9 = (ulong)psVar3[uVar14];
      }
      uVar13 = uVar14;
      if (psVar4 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar4[uVar14];
      }
      puVar5 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) &&
         ((puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0)))) {
        iVar1 = ldata[uVar9];
        iVar2 = rdata[uVar13];
        if (iVar2 < 0) {
          if (iVar1 < -999999999 - iVar2) goto LAB_0142b6f2;
        }
        else if (999999999 - iVar2 < iVar1) {
LAB_0142b6f2:
          pOVar12 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,
                     "Overflow in addition of DECIMAL(18) (%d + %d). You might want to add an explicit cast to a bigger decimal."
                     ,"");
          OutOfRangeException::OutOfRangeException<int,int>(pOVar12,&local_78,iVar1,iVar2);
          __cxa_throw(pOVar12,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        result_data[uVar14] = iVar2 + iVar1;
      }
      else {
        _Var11._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var11._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_38);
          sVar8 = local_78._M_string_length;
          _Var7._M_p = local_78._M_dataplus._M_p;
          local_78._M_dataplus._M_p = (pointer)0x0;
          local_78._M_string_length = 0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var7._M_p;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar8;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_50);
          _Var11._M_head_impl =
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var11._M_head_impl;
          rdata = local_48;
          ldata = local_40;
        }
        bVar6 = (byte)uVar14 & 0x3f;
        _Var11._M_head_impl[uVar14 >> 6] =
             _Var11._M_head_impl[uVar14 >> 6] & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6)
        ;
      }
      uVar14 = uVar14 + 1;
    } while (count != uVar14);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}